

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smyblas2.c
# Opt level: O1

void susolve(int ldm,int ncol,float *M,float *rhs)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  float *pfVar5;
  uint uVar6;
  int iVar7;
  
  if (0 < ncol) {
    pfVar5 = M + ((ulong)(uint)ncol - 1) * (long)ldm;
    uVar6 = ncol - 1;
    iVar7 = 0;
    uVar4 = (ulong)(uint)ncol;
    do {
      fVar1 = rhs[uVar4 - 1];
      fVar2 = M[uVar4 + (long)((int)(uVar4 - 1) * ldm) + -1];
      rhs[uVar4 - 1] = fVar1 / fVar2;
      if (1 < (long)uVar4) {
        uVar3 = 0;
        do {
          rhs[uVar3] = pfVar5[uVar3] * -(fVar1 / fVar2) + rhs[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      iVar7 = iVar7 + 1;
      pfVar5 = pfVar5 + -(long)ldm;
      uVar6 = uVar6 - 1;
      uVar4 = uVar4 - 1;
    } while (iVar7 != ncol);
  }
  return;
}

Assistant:

void
susolve (int ldm, int ncol, float *M, float *rhs)
{
    float xj;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	xj = rhs[jcol] / M[jcol + jcol*ldm]; 		/* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++)
	    rhs[irow] -= xj * M[irow + jcol*ldm];	/* M(irow, jcol) */

	jcol--;

    }
}